

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O0

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::unassign(WorkData *this,uint32_t varId,uint32_t regId)

{
  bool bVar1;
  uint in_EDX;
  uint in_ESI;
  WorkData *in_RDI;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  uint32_t in_stack_ffffffffffffffcc;
  
  bVar1 = isAssigned(in_RDI,in_stack_ffffffffffffffcc);
  if (!bVar1) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if (in_RDI->_physToVarId[in_EDX] != in_ESI) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  in_RDI->_physToVarId[in_EDX] = 0xff;
  in_RDI->_assignedRegs = 1 << ((byte)in_EDX & 0x1f) ^ in_RDI->_assignedRegs;
  return;
}

Assistant:

inline void unassign(uint32_t varId, uint32_t regId) noexcept {
      ASMJIT_ASSERT(isAssigned(regId));
      ASMJIT_ASSERT(_physToVarId[regId] == varId);

      DebugUtils::unused(varId);
      _physToVarId[regId] = uint8_t(kVarIdNone);
      _assignedRegs ^= Support::bitMask(regId);
    }